

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

int __thiscall QWizard::nextId(QWizard *this)

{
  QWizardPage *pQVar1;
  QWizard *in_RDI;
  QWizardPage *page;
  int local_4;
  
  pQVar1 = currentPage(in_RDI);
  if (pQVar1 == (QWizardPage *)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = (**(code **)(*(long *)&pQVar1->super_QWidget + 0x1c0))();
  }
  return local_4;
}

Assistant:

int QWizard::nextId() const
{
    const QWizardPage *page = currentPage();
    if (!page)
        return -1;

    return page->nextId();
}